

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O1

void Gia_ObjSimCollect(Gia_SimRsbMan_t *p)

{
  int iVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  undefined8 uVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  Gia_Man_t *pGVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  p->vFanins2->nSize = 0;
  if (p->vFanins->nSize < 1) {
    __assert_fail("Vec_IntSize(p->vFanins) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x27e,"void Gia_ObjSimCollect(Gia_SimRsbMan_t *)");
  }
  pVVar6 = p->vFanins;
  if (0 < pVVar6->nSize) {
    lVar11 = 0;
    do {
      iVar1 = pVVar6->pArray[lVar11];
      lVar12 = (long)iVar1;
      if ((lVar12 < 0) || (pGVar7 = p->pGia, pGVar7->nObjs <= iVar1)) {
LAB_007c9fbb:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = pGVar7->pObjs;
      uVar9 = (uint)*(undefined8 *)(pGVar3 + lVar12);
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        iVar8 = iVar1 - (uVar9 & 0x1fffffff);
        if (pGVar7->nTravIdsAlloc <= iVar8) goto LAB_007c9fda;
        if (pGVar7->pTravIds[iVar8] != pGVar7->nTravIds) {
          Vec_IntPush(p->vFanins2,iVar8);
        }
      }
      uVar4 = *(undefined8 *)(pGVar3 + lVar12);
      uVar9 = (uint)uVar4;
      if ((~uVar9 & 0x1fffffff) != 0 && -1 < (int)uVar9) {
        pGVar7 = p->pGia;
        iVar8 = iVar1 - ((uint)((ulong)uVar4 >> 0x20) & 0x1fffffff);
        if (pGVar7->nTravIdsAlloc <= iVar8) {
LAB_007c9fda:
          __assert_fail("Id < p->nTravIdsAlloc",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x268,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
        }
        if (pGVar7->pTravIds[iVar8] != pGVar7->nTravIds) {
          Vec_IntPush(p->vFanins2,iVar8);
        }
      }
      pGVar7 = p->pGia;
      pVVar6 = pGVar7->vFanoutNums;
      if (pVVar6->nSize <= iVar1) {
LAB_007c9f9c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = 0;
      while (iVar8 < pVVar6->pArray[lVar12]) {
        iVar2 = pGVar7->vFanout->nSize;
        if (iVar2 <= iVar1) goto LAB_007c9f9c;
        piVar5 = pGVar7->vFanout->pArray;
        uVar9 = piVar5[lVar12] + iVar8;
        if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) goto LAB_007c9f9c;
        iVar2 = piVar5[uVar9];
        lVar10 = (long)iVar2;
        if ((lVar10 < 0) || (pGVar7->nObjs <= iVar2)) goto LAB_007c9fbb;
        if ((~*(uint *)(pGVar7->pObjs + lVar10) & 0x1fffffff) != 0 &&
            -1 < (int)*(uint *)(pGVar7->pObjs + lVar10)) {
          if (pGVar7->nTravIdsAlloc <= iVar2) goto LAB_007c9fda;
          if (pGVar7->pTravIds[lVar10] != pGVar7->nTravIds) {
            Vec_IntPush(p->vFanins2,iVar2);
          }
        }
        iVar8 = iVar8 + 1;
        pGVar7 = p->pGia;
        pVVar6 = pGVar7->vFanoutNums;
        if (pVVar6->nSize <= iVar1) goto LAB_007c9f9c;
      }
      lVar11 = lVar11 + 1;
      pVVar6 = p->vFanins;
    } while (lVar11 < pVVar6->nSize);
  }
  return;
}

Assistant:

void Gia_ObjSimCollect( Gia_SimRsbMan_t * p )
{
    int i, k, iTemp, iFanout;
    Vec_IntClear( p->vFanins2 );
    assert( Vec_IntSize(p->vFanins) > 0 );
    Vec_IntForEachEntry( p->vFanins, iTemp, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p->pGia, iTemp );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId0(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId0(pObj, iTemp) );
        if ( Gia_ObjIsAnd(pObj) && !Gia_ObjIsTravIdCurrentId( p->pGia, Gia_ObjFaninId1(pObj, iTemp) ) )
            Vec_IntPush( p->vFanins2, Gia_ObjFaninId1(pObj, iTemp) );
        Gia_ObjForEachFanoutStaticId( p->pGia, iTemp, iFanout, k )
            if ( Gia_ObjIsAnd(Gia_ManObj(p->pGia, iFanout)) && !Gia_ObjIsTravIdCurrentId( p->pGia, iFanout ) )
                Vec_IntPush( p->vFanins2, iFanout );
    }
}